

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanePart.cpp
# Opt level: O1

void __thiscall PlanePart::next(PlanePart *this,bool action)

{
  int iVar1;
  bool *pbVar2;
  long lVar3;
  double dVar4;
  vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
  PlanePartWithProba;
  vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_> local_28;
  
  nextPlanePartPossible(&local_28,this,action);
  iVar1 = rand();
  if ((long)local_28.
            super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_28.
            super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar3 = ((long)local_28.
                   super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_28.
                   super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    dVar4 = (double)iVar1 / 2147483647.0;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    pbVar2 = &((local_28.
                super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->second).whichPente;
    do {
      if (dVar4 <= *(double *)(pbVar2 + -0x30)) {
        this->frequency = *(double *)(pbVar2 + -8);
        this->whichPente = *pbVar2;
        break;
      }
      dVar4 = dVar4 - *(double *)(pbVar2 + -0x30);
      pbVar2 = pbVar2 + 0x38;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  if (local_28.
      super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PlanePart::next(bool action) {
    vector<pair<double,PlanePart>> PlanePartWithProba = nextPlanePartPossible(action);
    double probaChoice = (double) rand() / RAND_MAX;

    // On boucle sur toute les pièces du vecteur pour déterminer laquelle on choisit
    for (int i = 0; i < PlanePartWithProba.size(); i ++) {
        if (probaChoice - PlanePartWithProba[i].first > 0) {
            probaChoice -= PlanePartWithProba[i].first;
        }
        else {
            frequency = PlanePartWithProba[i].second.frequency;
            whichPente = PlanePartWithProba[i].second.whichPente;
            return;
        }
    }
}